

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O3

void PatchFixSoftlocks::fix_reverse_greenmaze_fountain_softlock(World *world)

{
  Entity *this;
  Entity *this_00;
  mapped_type *ppMVar1;
  Flag is_mercator_fountain_open;
  bool local_e5;
  uint local_e4;
  undefined **local_e0;
  undefined2 local_d8;
  uchar local_d6 [6];
  Attributes local_d0;
  Attributes local_80;
  
  local_e0 = &PTR_to_json_abi_cxx11__00262898;
  local_d8 = 0xe;
  local_d6[0] = '\x01';
  this = (Entity *)operator_new(0x58);
  local_80.type_id = '\x15';
  local_80.position.x = '\x15';
  local_80.position.y = '\x16';
  local_80.position.z = '\0';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\0';
  local_80.palette = '\x02';
  local_80.behavior_id = 0;
  local_80.speed = '\0';
  local_80.fightable = false;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = false;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.entity_to_use_tiles_from = (Entity *)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  Entity::Entity(this,&local_80);
  if (local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e5 = false;
  local_e4 = 0xe;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(this->_attrs).mask_flags,
             &local_e5,(int *)&local_e4,local_d6);
  this_00 = (Entity *)operator_new(0x58);
  local_d0.type_id = '\x15';
  local_d0.position.x = '\x15';
  local_d0.position.y = '\x17';
  local_d0.position.z = '\0';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\x02';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(this_00,&local_d0);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e5 = false;
  local_e4 = (uint)(byte)local_d8;
  std::vector<EntityMaskFlag,std::allocator<EntityMaskFlag>>::
  emplace_back<bool,int,unsigned_char_const&>
            ((vector<EntityMaskFlag,std::allocator<EntityMaskFlag>> *)&(this_00->_attrs).mask_flags,
             &local_e5,(int *)&local_e4,local_d6);
  local_e4._0_2_ = 0x1cc;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)&local_e4);
  Map::add_entity(*ppMVar1,this);
  local_e4 = CONCAT22(local_e4._2_2_,0x1cc);
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)&local_e4);
  Map::add_entity(*ppMVar1,this_00);
  return;
}

Assistant:

static void fix_reverse_greenmaze_fountain_softlock(World& world)
    {
        Flag is_mercator_fountain_open(0xE, 1);

        Entity* platform_1 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 22, 0, false, false, false),
                .palette = 2
        });
        platform_1->remove_when_flag_is_set(is_mercator_fountain_open);

        Entity* platform_2 = new Entity({
                .type_id = ENTITY_SMALL_YELLOW_PLATFORM,
                .position = Position(21, 23, 0, false, false, false),
                .palette = 2
        });
        platform_2->remove_when_flag_is_set(is_mercator_fountain_open);

        world.map(MAP_460)->add_entity(platform_1);
        world.map(MAP_460)->add_entity(platform_2);
    }